

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O0

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetStackFrame(cmDebuggerThread *this,int64_t frameId)

{
  bool bVar1;
  pointer ppVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar3;
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
  local_50 [3];
  _Node_iterator_base<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false>
  local_38;
  iterator it;
  unique_lock<std::mutex> lock;
  int64_t frameId_local;
  cmDebuggerThread *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&it,(mutex_type *)(frameId + 0x78));
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
       ::find((unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
               *)(frameId + 0x40),(key_type *)&lock._M_owns);
  local_50[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
       ::end((unordered_map<long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>_>_>
              *)(frameId + 0x40));
  bVar1 = std::__detail::operator==(&local_38,local_50);
  if (bVar1) {
    std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)this);
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_long,_std::shared_ptr<cmDebugger::cmDebuggerStackFrame>_>,_false,_false>
                           *)&local_38);
    std::shared_ptr<cmDebugger::cmDebuggerStackFrame>::shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerStackFrame> *)this,&ppVar2->second);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it);
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar3.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetStackFrame(
  int64_t frameId)
{
  std::unique_lock<std::mutex> lock(Mutex);
  auto it = FrameMap.find(frameId);

  if (it == FrameMap.end()) {
    return {};
  }

  return it->second;
}